

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_controller.h
# Opt level: O0

bool __thiscall n_e_s::core::NesController::get(NesController *this,Button button)

{
  Button button_local;
  NesController *this_local;
  
  switch(button) {
  case A:
    this_local._7_1_ = (bool)(this->a_ & 1);
    break;
  case B:
    this_local._7_1_ = (bool)(this->b_ & 1);
    break;
  case Select:
    this_local._7_1_ = (bool)(this->select_ & 1);
    break;
  case Start:
    this_local._7_1_ = (bool)(this->start_ & 1);
    break;
  case Up:
    this_local._7_1_ = (bool)(this->up_ & 1);
    break;
  case Down:
    this_local._7_1_ = (bool)(this->down_ & 1);
    break;
  case Left:
    this_local._7_1_ = (bool)(this->left_ & 1);
    break;
  case Right:
    this_local._7_1_ = (bool)(this->right_ & 1);
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool get(Button button) override {
        switch (button) {
        case Button::A:
            return a_;
        case Button::B:
            return b_;
        case Button::Select:
            return select_;
        case Button::Start:
            return start_;
        case Button::Up:
            return up_;
        case Button::Down:
            return down_;
        case Button::Left:
            return left_;
        case Button::Right:
            return right_;
        default:
            return false;
        }
    }